

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

void add_param(cod_parse_context parse_context,char *name,int param_num,FMFormat format)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  FMFieldList fl;
  sm_ref param;
  sm_ref type;
  int i;
  FMStructDescList list;
  int local_2c;
  
  puVar1 = (undefined8 *)format_list_of_FMFormat(in_RCX);
  local_2c = 1;
  while (puVar1[(long)local_2c * 4] != 0) {
    cod_add_simple_struct_type(puVar1[(long)local_2c * 4],puVar1[(long)local_2c * 4 + 1],in_RDI);
    local_2c = local_2c + 1;
  }
  uVar2 = cod_build_type_node(*puVar1,puVar1[1]);
  cod_add_decl_to_parse_context(*puVar1,uVar2,in_RDI);
  uVar2 = cod_build_param_node(in_RSI,uVar2,in_EDX);
  cod_add_decl_to_parse_context(in_RSI,uVar2,in_RDI);
  return;
}

Assistant:

static void
add_param(cod_parse_context parse_context, char *name, int param_num,
	  FMFormat format)
{
    FMStructDescList list = format_list_of_FMFormat(format);
    int i = 1;
    sm_ref type, param;
    while (list[i].format_name != NULL) {
	FMFieldList fl = list[i].field_list;
	/* step through input formats */
	cod_add_simple_struct_type(list[i].format_name, fl, parse_context);
	i++;
    }
    type = cod_build_type_node(list[0].format_name, list[0].field_list);
    cod_add_decl_to_parse_context(list[0].format_name, type, parse_context);

    param = cod_build_param_node(name, type, param_num);

    cod_add_decl_to_parse_context(name, param, parse_context);
}